

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

ssize_t file_read_asciiz(FILE *stream,char *buffer,size_t size)

{
  int iVar1;
  ulong uVar2;
  
  if (size == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    do {
      if (size - 1 == uVar2) {
        return -1;
      }
      iVar1 = getc_unlocked((FILE *)stream);
      if (iVar1 == -1) {
        return -1;
      }
      buffer[uVar2] = (char)iVar1;
    } while ((iVar1 != 0) && (uVar2 = (ulong)((int)uVar2 + 1), uVar2 < size));
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  return uVar2;
}

Assistant:

ssize_t
file_read_asciiz(
    FILE* stream,
    char* buffer,
    size_t size)
{
    unsigned int i;
    int c;
    for (i = 0; i < size; ++i) {
        if (i == size - 1) {
            return -1;
        }
        c = getc_unlocked(stream);
        if (c == EOF) {
            return -1;
        }
        buffer[i] = c;
        if (!c)
            break;
    }
    return i + 1;
}